

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl2.cpp
# Opt level: O3

void ImGui_ImplOpenGL2_RenderDrawData(ImDrawData *draw_data)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ImDrawList *pIVar3;
  ImDrawVert *pIVar4;
  ImDrawCmd *pIVar5;
  code *pcVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined4 in_EAX;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  GLint last_tex_env_mode;
  GLint last_shade_model;
  GLint last_texture;
  GLint last_polygon_mode [2];
  GLint last_scissor_box [4];
  GLint last_viewport [4];
  GLint local_ac;
  GLenum local_a8;
  GLuint local_a4;
  GLenum local_a0;
  GLenum local_9c;
  int local_98;
  int iStack_94;
  undefined8 uStack_90;
  GLint local_88;
  GLint local_84;
  GLsizei local_80;
  GLsizei local_7c;
  GLint local_78;
  GLint local_74;
  GLsizei local_70;
  GLsizei local_6c;
  uint *local_60;
  ImVec2 local_58;
  undefined8 uStack_50;
  ImVec2 local_48;
  undefined8 uStack_40;
  
  local_98 = (int)((draw_data->FramebufferScale).x * (draw_data->DisplaySize).x);
  iStack_94 = (int)((draw_data->FramebufferScale).y * (draw_data->DisplaySize).y);
  auVar7._4_4_ = -(uint)(local_98 == 0);
  auVar7._0_4_ = -(uint)(local_98 == 0);
  auVar7._8_4_ = -(uint)(iStack_94 == 0);
  auVar7._12_4_ = -(uint)(iStack_94 == 0);
  iVar9 = movmskpd(in_EAX,auVar7);
  if (iVar9 == 0) {
    uStack_90 = 0;
    (*glad_glGetIntegerv)(0x8069,(GLint *)&local_a4);
    (*glad_glGetIntegerv)(0xb40,(GLint *)&local_a0);
    (*glad_glGetIntegerv)(0xba2,&local_78);
    (*glad_glGetIntegerv)(0xc10,&local_88);
    (*glad_glGetIntegerv)(0xb54,(GLint *)&local_a8);
    (*glad_glGetTexEnviv)(0x2300,0x2200,&local_ac);
    (*glad_glPushAttrib)(0x7000);
    iVar9 = local_98;
    _local_98 = CONCAT44(iStack_94,iStack_94);
    ImGui_ImplOpenGL2_SetupRenderState(draw_data,iVar9,iStack_94);
    if (0 < draw_data->CmdListsCount) {
      local_48 = draw_data->DisplayPos;
      uStack_40 = 0;
      fVar15 = (float)local_98;
      local_58 = draw_data->FramebufferScale;
      uStack_50 = 0;
      lVar11 = 0;
      do {
        pIVar3 = (draw_data->CmdLists).Data[lVar11];
        local_60 = (pIVar3->IdxBuffer).Data;
        pIVar4 = (pIVar3->VtxBuffer).Data;
        (*glad_glVertexPointer)(2,0x1406,0x14,pIVar4);
        (*glad_glTexCoordPointer)(2,0x1406,0x14,&pIVar4->uv);
        (*glad_glColorPointer)(4,0x1401,0x14,&pIVar4->col);
        if (0 < (pIVar3->CmdBuffer).Size) {
          lVar10 = 0;
          lVar12 = 0;
          do {
            pIVar5 = (pIVar3->CmdBuffer).Data;
            pcVar6 = *(code **)((long)&pIVar5->UserCallback + lVar10);
            if (pcVar6 == (code *)0x0) {
              uVar1 = *(undefined8 *)((long)&(pIVar5->ClipRect).x + lVar10);
              uVar2 = *(undefined8 *)((long)&(pIVar5->ClipRect).z + lVar10);
              fVar18 = ((float)uVar1 - local_48.x) * local_58.x;
              fVar19 = ((float)((ulong)uVar1 >> 0x20) - local_48.y) * local_58.y;
              fVar16 = ((float)uVar2 - local_48.x) * local_58.x;
              fVar17 = ((float)((ulong)uVar2 >> 0x20) - local_48.y) * local_58.y;
              iVar13 = -(uint)(fVar18 < fVar16);
              iVar14 = -(uint)(fVar19 < fVar17);
              auVar8._4_4_ = iVar13;
              auVar8._0_4_ = iVar13;
              auVar8._8_4_ = iVar14;
              auVar8._12_4_ = iVar14;
              iVar13 = movmskpd(0,auVar8);
              if (iVar13 == 3) {
                (*glad_glScissor)((int)fVar18,(int)(fVar15 - fVar17),(int)(fVar16 - fVar18),
                                  (int)(fVar17 - fVar19));
                (*glad_glBindTexture)(0xde1,*(GLuint *)((long)&pIVar5->TextureId + lVar10));
                (*glad_glDrawElements)
                          (4,*(GLsizei *)((long)&pIVar5->ElemCount + lVar10),0x1405,
                           local_60 + *(uint *)((long)&pIVar5->IdxOffset + lVar10));
              }
            }
            else if (pcVar6 == (code *)0xfffffffffffffff8) {
              ImGui_ImplOpenGL2_SetupRenderState(draw_data,iVar9,local_98);
            }
            else {
              (*pcVar6)(pIVar3,(long)&(pIVar5->ClipRect).x + lVar10);
            }
            lVar12 = lVar12 + 1;
            lVar10 = lVar10 + 0x38;
          } while (lVar12 < (pIVar3->CmdBuffer).Size);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < draw_data->CmdListsCount);
    }
    (*glad_glDisableClientState)(0x8076);
    (*glad_glDisableClientState)(0x8078);
    (*glad_glDisableClientState)(0x8074);
    (*glad_glBindTexture)(0xde1,local_a4);
    (*glad_glMatrixMode)(0x1700);
    (*glad_glPopMatrix)();
    (*glad_glMatrixMode)(0x1701);
    (*glad_glPopMatrix)();
    (*glad_glPopAttrib)();
    (*glad_glPolygonMode)(0x404,local_a0);
    (*glad_glPolygonMode)(0x405,local_9c);
    (*glad_glViewport)(local_78,local_74,local_70,local_6c);
    (*glad_glScissor)(local_88,local_84,local_80,local_7c);
    (*glad_glShadeModel)(local_a8);
    (*glad_glTexEnvi)(0x2300,0x2200,local_ac);
  }
  return;
}

Assistant:

void ImGui_ImplOpenGL2_RenderDrawData(ImDrawData* draw_data)
{
    // Avoid rendering when minimized, scale coordinates for retina displays (screen coordinates != framebuffer coordinates)
    int fb_width = (int)(draw_data->DisplaySize.x * draw_data->FramebufferScale.x);
    int fb_height = (int)(draw_data->DisplaySize.y * draw_data->FramebufferScale.y);
    if (fb_width == 0 || fb_height == 0)
        return;

    // Backup GL state
    GLint last_texture; glGetIntegerv(GL_TEXTURE_BINDING_2D, &last_texture);
    GLint last_polygon_mode[2]; glGetIntegerv(GL_POLYGON_MODE, last_polygon_mode);
    GLint last_viewport[4]; glGetIntegerv(GL_VIEWPORT, last_viewport);
    GLint last_scissor_box[4]; glGetIntegerv(GL_SCISSOR_BOX, last_scissor_box);
    GLint last_shade_model; glGetIntegerv(GL_SHADE_MODEL, &last_shade_model);
    GLint last_tex_env_mode; glGetTexEnviv(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, &last_tex_env_mode);
    glPushAttrib(GL_ENABLE_BIT | GL_COLOR_BUFFER_BIT | GL_TRANSFORM_BIT);

    // Setup desired GL state
    ImGui_ImplOpenGL2_SetupRenderState(draw_data, fb_width, fb_height);

    // Will project scissor/clipping rectangles into framebuffer space
    ImVec2 clip_off = draw_data->DisplayPos;         // (0,0) unless using multi-viewports
    ImVec2 clip_scale = draw_data->FramebufferScale; // (1,1) unless using retina display which are often (2,2)

    // Render command lists
    for (int n = 0; n < draw_data->CmdListsCount; n++)
    {
        const ImDrawList* cmd_list = draw_data->CmdLists[n];
        const ImDrawVert* vtx_buffer = cmd_list->VtxBuffer.Data;
        const ImDrawIdx* idx_buffer = cmd_list->IdxBuffer.Data;
        glVertexPointer(2, GL_FLOAT, sizeof(ImDrawVert), (const GLvoid*)((const char*)vtx_buffer + offsetof(ImDrawVert, pos)));
        glTexCoordPointer(2, GL_FLOAT, sizeof(ImDrawVert), (const GLvoid*)((const char*)vtx_buffer + offsetof(ImDrawVert, uv)));
        glColorPointer(4, GL_UNSIGNED_BYTE, sizeof(ImDrawVert), (const GLvoid*)((const char*)vtx_buffer + offsetof(ImDrawVert, col)));

        for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++)
        {
            const ImDrawCmd* pcmd = &cmd_list->CmdBuffer[cmd_i];
            if (pcmd->UserCallback)
            {
                // User callback, registered via ImDrawList::AddCallback()
                // (ImDrawCallback_ResetRenderState is a special callback value used by the user to request the renderer to reset render state.)
                if (pcmd->UserCallback == ImDrawCallback_ResetRenderState)
                    ImGui_ImplOpenGL2_SetupRenderState(draw_data, fb_width, fb_height);
                else
                    pcmd->UserCallback(cmd_list, pcmd);
            }
            else
            {
                // Project scissor/clipping rectangles into framebuffer space
                ImVec2 clip_min((pcmd->ClipRect.x - clip_off.x) * clip_scale.x, (pcmd->ClipRect.y - clip_off.y) * clip_scale.y);
                ImVec2 clip_max((pcmd->ClipRect.z - clip_off.x) * clip_scale.x, (pcmd->ClipRect.w - clip_off.y) * clip_scale.y);
                if (clip_max.x <= clip_min.x || clip_max.y <= clip_min.y)
                    continue;

                // Apply scissor/clipping rectangle (Y is inverted in OpenGL)
                glScissor((int)clip_min.x, (int)((float)fb_height - clip_max.y), (int)(clip_max.x - clip_min.x), (int)(clip_max.y - clip_min.y));

                // Bind texture, Draw
                glBindTexture(GL_TEXTURE_2D, (GLuint)(intptr_t)pcmd->GetTexID());
                glDrawElements(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, idx_buffer + pcmd->IdxOffset);
            }
        }
    }

    // Restore modified GL state
    glDisableClientState(GL_COLOR_ARRAY);
    glDisableClientState(GL_TEXTURE_COORD_ARRAY);
    glDisableClientState(GL_VERTEX_ARRAY);
    glBindTexture(GL_TEXTURE_2D, (GLuint)last_texture);
    glMatrixMode(GL_MODELVIEW);
    glPopMatrix();
    glMatrixMode(GL_PROJECTION);
    glPopMatrix();
    glPopAttrib();
    glPolygonMode(GL_FRONT, (GLenum)last_polygon_mode[0]); glPolygonMode(GL_BACK, (GLenum)last_polygon_mode[1]);
    glViewport(last_viewport[0], last_viewport[1], (GLsizei)last_viewport[2], (GLsizei)last_viewport[3]);
    glScissor(last_scissor_box[0], last_scissor_box[1], (GLsizei)last_scissor_box[2], (GLsizei)last_scissor_box[3]);
    glShadeModel(last_shade_model);
    glTexEnvi(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, last_tex_env_mode);
}